

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBufferBindingQueryCase::iterate
          (TextureBufferBindingQueryCase *this)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  deBool dVar3;
  int iVar4;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  undefined4 extraout_var;
  TestLog *pTVar6;
  Enum<int,_2UL> EVar7;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  ScopedLogSection local_248;
  ScopedLogSection section_2;
  TestLog *local_230;
  int local_228;
  string local_220;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  GLenum local_174;
  GLuint local_170;
  deUint32 err;
  GLuint buffer;
  allocator<char> local_141;
  string local_140;
  ScopedLogSection local_120;
  ScopedLogSection section_1;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  ScopedLogSection local_c8;
  ScopedLogSection section;
  string local_b8;
  undefined1 local_98 [8];
  ResultCollector result;
  CallLogWrapper gl;
  bool supportsES32;
  TextureBufferBindingQueryCase *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  while( true ) {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) break;
    if (!bVar1) {
      this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_texture_buffer");
      if (!bVar2) break;
    }
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      iVar4 = (*pRVar5->_vptr_RenderContext[3])();
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::CallLogWrapper::CallLogWrapper
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
                 (Functions *)CONCAT44(extraout_var,iVar4),pTVar6);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8," // ERROR: ",(allocator<char> *)((long)&section.m_log + 7));
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_98,pTVar6,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
      glu::CallLogWrapper::enableLogging
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"initial",&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Initial value",
                 (allocator<char> *)((long)&section_1.m_log + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar6,&local_e8,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      deqp::gls::StateQueryUtil::verifyStateInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,0x8c2a,0,this->m_type);
      tcu::ScopedLogSection::~ScopedLogSection(&local_c8);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"bind",&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"After bind",(allocator<char> *)((long)&err + 3));
      tcu::ScopedLogSection::ScopedLogSection(&local_120,pTVar6,&local_140,(string *)&buffer);
      std::__cxx11::string::~string((string *)&buffer);
      std::allocator<char>::~allocator((allocator<char> *)((long)&err + 3));
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      glu::CallLogWrapper::glGenBuffers
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_170);
      glu::CallLogWrapper::glBindBuffer
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c2a,local_170);
      do {
        local_174 = glu::CallLogWrapper::glGetError
                              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
        if (local_174 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,"Got Error ",&local_1f9);
          EVar7 = glu::getErrorStr(local_174);
          section_2.m_log = (TestLog *)EVar7.m_getName;
          local_228 = EVar7.m_value;
          local_230 = section_2.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_220,&local_230);
          std::operator+(&local_1d8,&local_1f8,&local_220);
          std::operator+(&local_1b8,&local_1d8,": ");
          std::operator+(&local_198,&local_1b8,"bind buffer");
          tcu::ResultCollector::fail((ResultCollector *)local_98,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::allocator<char>::~allocator(&local_1f9);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      deqp::gls::StateQueryUtil::verifyStateInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,0x8c2a,local_170,this->m_type);
      glu::CallLogWrapper::glDeleteBuffers
                ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_170);
      tcu::ScopedLogSection::~ScopedLogSection(&local_120);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"bind",&local_269);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"After delete",&local_291);
      tcu::ScopedLogSection::ScopedLogSection(&local_248,pTVar6,&local_268,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator(&local_291);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator(&local_269);
      deqp::gls::StateQueryUtil::verifyStateInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,0x8c2a,0,this->m_type);
      tcu::ScopedLogSection::~ScopedLogSection(&local_248);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_98,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_98);
      glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
      return STOP;
    }
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"GL_EXT_texture_buffer is not supported",
             "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
             ,0xdf);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureBufferBindingQueryCase::IterateResult TextureBufferBindingQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial value");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, 0, m_type);
	}

	// bind
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After bind");

		glw::GLuint buffer;

		gl.glGenBuffers(1, &buffer);
		gl.glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind buffer");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, buffer, m_type);

		gl.glDeleteBuffers(1, &buffer);
	}

	// after delete
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "bind", "After delete");

		verifyStateInteger(result, gl, GL_TEXTURE_BUFFER_BINDING, 0, m_type);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}